

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
BytesToBits(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
           vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  reference rVar5;
  allocator_type local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,
             ((long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) * 8,&local_29);
  uVar4 = 0;
  while( true ) {
    if ((ulong)(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= (ulong)uVar4)
    break;
    bVar1 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4 >> 3];
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)uVar4);
    puVar2 = rVar5._M_p;
    if ((bVar1 >> (uVar4 & 7) & 1) == 0) {
      uVar3 = ~rVar5._M_mask & *puVar2;
    }
    else {
      uVar3 = rVar5._M_mask | *puVar2;
    }
    *puVar2 = uVar3;
    uVar4 = uVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<bool> BytesToBits(const std::vector<unsigned char>& bytes)
{
    std::vector<bool> ret(bytes.size() * 8);
    for (unsigned int p = 0; p < ret.size(); p++) {
        ret[p] = (bytes[p / 8] & (1 << (p % 8))) != 0;
    }
    return ret;
}